

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ResetAllSchemasOfConnection(sqlite3 *db)

{
  void *p;
  int iVar1;
  long lVar2;
  long lVar3;
  
  if (db->noSharedCache == '\0') {
    btreeEnterAll(db);
  }
  iVar1 = db->nDb;
  if (0 < iVar1) {
    lVar2 = 0x18;
    lVar3 = 0;
    do {
      p = *(void **)((long)&db->aDb->zDbSName + lVar2);
      if (p != (void *)0x0) {
        if (db->nSchemaLock == 0) {
          sqlite3SchemaClear(p);
          iVar1 = db->nDb;
        }
        else {
          *(byte *)((long)p + 0x72) = *(byte *)((long)p + 0x72) | 8;
        }
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x20;
    } while (lVar3 < iVar1);
  }
  *(byte *)&db->mDbFlags = (byte)db->mDbFlags & 0xee;
  sqlite3VtabUnlockList(db);
  if (db->noSharedCache == '\0') {
    btreeLeaveAll(db);
  }
  if (db->nSchemaLock != 0) {
    return;
  }
  sqlite3CollapseDatabaseArray(db);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ResetAllSchemasOfConnection(sqlite3 *db){
  int i;
  sqlite3BtreeEnterAll(db);
  for(i=0; i<db->nDb; i++){
    Db *pDb = &db->aDb[i];
    if( pDb->pSchema ){
      if( db->nSchemaLock==0 ){
        sqlite3SchemaClear(pDb->pSchema);
      }else{
        DbSetProperty(db, i, DB_ResetWanted);
      }
    }
  }
  db->mDbFlags &= ~(DBFLAG_SchemaChange|DBFLAG_SchemaKnownOk);
  sqlite3VtabUnlockList(db);
  sqlite3BtreeLeaveAll(db);
  if( db->nSchemaLock==0 ){
    sqlite3CollapseDatabaseArray(db);
  }
}